

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

Pubkey * cfd::core::ConvertSecpPubkey
                   (Pubkey *__return_storage_ptr__,secp256k1_pubkey_conflict *pubkey)

{
  pointer puVar1;
  uchar *puVar2;
  CfdException *this;
  ByteData local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80;
  int local_5c;
  size_type sStack_58;
  int ret;
  size_t result_bytes_size;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_bytes;
  secp256k1_context_struct *ctx;
  secp256k1_pubkey_conflict *pubkey_local;
  
  result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator(&local_39);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x21,&local_39);
  ::std::allocator<unsigned_char>::~allocator(&local_39);
  sStack_58 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  puVar1 = result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  local_5c = secp256k1_ec_pubkey_serialize(puVar1,puVar2,&stack0xffffffffffffffa8,pubkey,0x102);
  if ((local_5c == 1) && (sStack_58 == 0x21)) {
    ByteData::ByteData(&local_a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    Pubkey::Pubkey(__return_storage_ptr__,&local_a0);
    ByteData::~ByteData(&local_a0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    return __return_storage_ptr__;
  }
  local_82 = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_80,"Secp256k1 serialize exception",&local_81);
  CfdException::CfdException(this,kCfdInternalError,&local_80);
  local_82 = 0;
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey ConvertSecpPubkey(const secp256k1_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(Pubkey::kCompressedPubkeySize);
  size_t result_bytes_size = result_bytes.size();
  int ret = secp256k1_ec_pubkey_serialize(
      ctx, result_bytes.data(), &result_bytes_size, &pubkey,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1 || (result_bytes_size != Pubkey::kCompressedPubkeySize)) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return Pubkey(result_bytes);
}